

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O1

Llb_Man_t * Llb_ManStart(Aig_Man_t *pAigGlo,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  int iVar2;
  Llb_Man_t *p;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Llb_Mtr_t *pLVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  
  Aig_ManCleanMarkA(pAig);
  p = (Llb_Man_t *)calloc(1,0x88);
  p->pAigGlo = pAigGlo;
  p->pPars = pPars;
  p->pAig = pAig;
  pVVar3 = Llb_ManMarkPivotNodes(pAig,pPars->fUsePivots);
  p->vVar2Obj = pVVar3;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 0;
  pVVar4->nSize = 0;
  pVVar4->pArray = (int *)0x0;
  uVar1 = pVVar3->nSize;
  if ((ulong)uVar1 != 0) {
    iVar11 = *pVVar3->pArray;
    if (1 < (int)uVar1) {
      uVar10 = 1;
      do {
        iVar2 = pVVar3->pArray[uVar10];
        if (iVar11 <= iVar2) {
          iVar11 = iVar2;
        }
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
    uVar1 = iVar11 + 1;
    if (-1 < iVar11) {
      piVar5 = (int *)malloc((ulong)uVar1 << 2);
      pVVar4->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar1;
      memset(piVar5,0xff,(ulong)uVar1 << 2);
    }
    pVVar4->nSize = uVar1;
    if (0 < pVVar3->nSize) {
      piVar5 = pVVar3->pArray;
      lVar9 = 0;
      do {
        uVar1 = piVar5[lVar9];
        if ((ulong)uVar1 != 0xffffffff) {
          if (((int)uVar1 < 0) || (iVar11 < (int)uVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar4->pArray[uVar1] = (int)lVar9;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar3->nSize);
    }
  }
  p->vObj2Var = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  p->vRings = pVVar6;
  Llb_ManPrepareVarMap(p);
  Llb_ManPrepareGroups(p);
  Aig_ManCleanMarkA(pAig);
  pLVar8 = Llb_MtrCreate(p);
  p->pMatrix = pLVar8;
  pLVar8->pMan = p;
  return p;
}

Assistant:

Llb_Man_t * Llb_ManStart( Aig_Man_t * pAigGlo, Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Man_t * p;
    Aig_ManCleanMarkA( pAig );
    p = ABC_CALLOC( Llb_Man_t, 1 );
    p->pAigGlo  = pAigGlo;
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->vVar2Obj = Llb_ManMarkPivotNodes( p->pAig, pPars->fUsePivots );
    p->vObj2Var = Vec_IntInvert( p->vVar2Obj, -1 );
    p->vRings   = Vec_PtrAlloc( 100 );
    Llb_ManPrepareVarMap( p );
    Llb_ManPrepareGroups( p );
    Aig_ManCleanMarkA( pAig );
    p->pMatrix = Llb_MtrCreate( p );
    p->pMatrix->pMan = p;
    return p;
}